

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::MakeDefaultFieldName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  string local_a0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  local_50[0] = absl::lts_20250127::NullSafeStringView("Impl_::");
  MakeDefaultName_abi_cxx11_(&local_a0,this,(FieldDescriptor *)local_50[0]._M_str);
  local_80.piece_._M_len = local_a0._M_string_length;
  local_80.piece_._M_str = local_a0._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_50,&local_80,
             (AlphaNum *)local_a0._M_string_length);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string MakeDefaultFieldName(const FieldDescriptor* field) {
  return absl::StrCat("Impl_::", MakeDefaultName(field));
}